

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  ostream *this;
  int failure;
  
  iVar1 = test();
  if (iVar1 == 0) {
    this = std::operator<<((ostream *)&std::cerr,"Success");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return iVar1;
}

Assistant:

int main()
{
  int failure =
#if MOCKARON_DISABLE_HOOKS
    testnohook();
#else
    test();
#endif

  if (!failure)
    std::cerr << "Success" << std::endl;

  return failure;
}